

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

string * __thiscall
QPDFObjectHandle::getUniqueResourceName
          (string *__return_storage_ptr__,QPDFObjectHandle *this,string *prefix,int *min_suffix,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *namesp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  long lVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  const_iterator cVar9;
  logic_error *this_00;
  ulong uVar10;
  size_type *psVar11;
  int iVar12;
  uint __len;
  uint uVar13;
  string __str;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  long *local_90 [2];
  long local_80 [2];
  uint *local_70;
  string *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_68 = prefix;
  if (namesp == (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    getResourceNames_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60,this);
  }
  else {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&local_60,&namesp->_M_t);
  }
  uVar2 = *min_suffix;
  uVar13 = uVar2;
  if ((local_60._M_impl.super__Rb_tree_header._M_node_count & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error
              (local_60._M_impl.super__Rb_tree_header._M_node_count);
    uVar13 = *min_suffix;
  }
  iVar12 = uVar2 + (int)local_60._M_impl.super__Rb_tree_header._M_node_count;
  local_70 = (uint *)min_suffix;
  if ((int)uVar13 <= iVar12) {
    paVar1 = &__return_storage_ptr__->field_2;
    do {
      uVar2 = -uVar13;
      if (0 < (int)uVar13) {
        uVar2 = uVar13;
      }
      __len = 1;
      if (9 < uVar2) {
        uVar10 = (ulong)uVar2;
        uVar6 = 4;
        do {
          __len = uVar6;
          uVar7 = (uint)uVar10;
          if (uVar7 < 100) {
            __len = __len - 2;
            goto LAB_001c4bf7;
          }
          if (uVar7 < 1000) {
            __len = __len - 1;
            goto LAB_001c4bf7;
          }
          if (uVar7 < 10000) goto LAB_001c4bf7;
          uVar10 = uVar10 / 10000;
          uVar6 = __len + 4;
        } while (99999 < uVar7);
        __len = __len + 1;
      }
LAB_001c4bf7:
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)((int)uVar13 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar13 >> 0x1f) + (long)local_90[0]),__len,uVar2);
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_90,0,(char *)0x0,(ulong)(local_68->_M_dataplus)._M_p)
      ;
      puVar5 = local_70;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        lVar4 = plVar8[3];
        paVar1->_M_allocated_capacity = *psVar11;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      }
      __return_storage_ptr__->_M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_60,__return_storage_ptr__);
      if ((_Rb_tree_header *)cVar9._M_node == &local_60._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_60);
        return __return_storage_ptr__;
      }
      uVar13 = *puVar5 + 1;
      *puVar5 = uVar13;
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        uVar13 = *puVar5;
      }
    } while ((int)uVar13 <= iVar12);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"unable to find unconflicting name in QPDFObjectHandle::getUniqueResourceName")
  ;
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string
QPDFObjectHandle::getUniqueResourceName(
    std::string const& prefix, int& min_suffix, std::set<std::string>* namesp) const
{
    std::set<std::string> names = (namesp ? *namesp : getResourceNames());
    int max_suffix = min_suffix + QIntC::to_int(names.size());
    while (min_suffix <= max_suffix) {
        std::string candidate = prefix + std::to_string(min_suffix);
        if (names.count(candidate) == 0) {
            return candidate;
        }
        // Increment after return; min_suffix should be the value
        // used, not the next value.
        ++min_suffix;
    }
    // This could only happen if there is a coding error.
    // The number of candidates we test is more than the
    // number of keys we're checking against.
    throw std::logic_error(
        "unable to find unconflicting name in QPDFObjectHandle::getUniqueResourceName");
}